

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
pstore::brokerface::fifo_path::get_default_path_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_30 [40];
  
  s_abi_cxx11_(local_30,"/var/tmp/",9);
  std::operator+(in_RDI,(char *)local_30);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string fifo_path::get_default_path () {
            // TODO: consider using /run/user/<userid> on Linux?
            return "/var/tmp/"s + default_pipe_name;
        }